

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vbox.cpp
# Opt level: O2

void __thiscall ftxui::anon_unknown_2::VBox::ComputeRequirement(VBox *this)

{
  undefined4 uVar1;
  undefined4 uVar2;
  Selection SVar3;
  int iVar4;
  pointer psVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  element_type *peVar9;
  shared_ptr<ftxui::Node> *child;
  pointer psVar10;
  
  (this->super_Node).requirement_.flex_grow_y = 0;
  (this->super_Node).requirement_.flex_shrink_x = 0;
  (this->super_Node).requirement_.flex_shrink_y = 0;
  (this->super_Node).requirement_.selection = NORMAL;
  (this->super_Node).requirement_.min_x = 0;
  (this->super_Node).requirement_.min_y = 0;
  (this->super_Node).requirement_.flex_grow_x = 0;
  (this->super_Node).requirement_.flex_grow_y = 0;
  psVar5 = (this->super_Node).children_.
           super__Vector_base<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (psVar10 = (this->super_Node).children_.
                 super__Vector_base<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; psVar10 != psVar5; psVar10 = psVar10 + 1
      ) {
    (*((psVar10->super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->_vptr_Node[2]
    )();
    iVar8 = (this->super_Node).requirement_.min_y;
    peVar9 = (psVar10->super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    SVar3 = (peVar9->requirement_).selection;
    if ((int)(this->super_Node).requirement_.selection < (int)SVar3) {
      (this->super_Node).requirement_.selection = SVar3;
      iVar4 = (peVar9->requirement_).selected_box.x_max;
      iVar6 = (peVar9->requirement_).selected_box.y_min;
      iVar7 = (peVar9->requirement_).selected_box.y_max;
      (this->super_Node).requirement_.selected_box.x_min = (peVar9->requirement_).selected_box.x_min
      ;
      (this->super_Node).requirement_.selected_box.x_max = iVar4;
      (this->super_Node).requirement_.selected_box.y_min = iVar6;
      (this->super_Node).requirement_.selected_box.y_max = iVar7;
      uVar1 = (this->super_Node).requirement_.selected_box.y_min;
      uVar2 = (this->super_Node).requirement_.selected_box.y_max;
      (this->super_Node).requirement_.selected_box.y_min = iVar8 + uVar1;
      (this->super_Node).requirement_.selected_box.y_max = iVar8 + uVar2;
      peVar9 = (psVar10->super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    }
    (this->super_Node).requirement_.min_y = iVar8 + (peVar9->requirement_).min_y;
    iVar8 = (peVar9->requirement_).min_x;
    iVar4 = (this->super_Node).requirement_.min_x;
    if (iVar8 < iVar4) {
      iVar8 = iVar4;
    }
    (this->super_Node).requirement_.min_x = iVar8;
  }
  return;
}

Assistant:

void ComputeRequirement() override {
    requirement_.min_x = 0;
    requirement_.min_y = 0;
    requirement_.flex_grow_x = 0;
    requirement_.flex_grow_y = 0;
    requirement_.flex_shrink_x = 0;
    requirement_.flex_shrink_y = 0;
    requirement_.selection = Requirement::NORMAL;
    for (auto& child : children_) {
      child->ComputeRequirement();
      if (requirement_.selection < child->requirement().selection) {
        requirement_.selection = child->requirement().selection;
        requirement_.selected_box = child->requirement().selected_box;
        requirement_.selected_box.y_min += requirement_.min_y;
        requirement_.selected_box.y_max += requirement_.min_y;
      }
      requirement_.min_y += child->requirement().min_y;
      requirement_.min_x =
          std::max(requirement_.min_x, child->requirement().min_x);
    }
  }